

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  Btree *p;
  Table *p_00;
  int iVar1;
  char *zSql_00;
  TriggerPrg *pT;
  int local_2b0;
  int mx;
  int iFirst;
  int mxLen;
  char *zSqlCopy;
  char *zDb;
  Btree *pBt;
  Parse sParse;
  int i;
  int rc;
  char *zErrMsg;
  sqlite3_stmt **ppStmt_local;
  Vdbe *pReprepare_local;
  u32 prepFlags_local;
  int nBytes_local;
  char *zSql_local;
  sqlite3 *db_local;
  
  _i = (char *)0x0;
  sParse.pWithToFree._4_4_ = 0;
  zErrMsg = (char *)ppStmt;
  ppStmt_local = (sqlite3_stmt **)pReprepare;
  pReprepare_local._0_4_ = prepFlags;
  pReprepare_local._4_4_ = nBytes;
  _prepFlags_local = zSql;
  zSql_local = (char *)db;
  memset(&pBt,0,0xc4);
  memset(&sParse.sNameToken.n,0,0x90);
  sParse.pVList = (VList *)ppStmt_local;
  if (((u32)pReprepare_local & 1) != 0) {
    sParse.colNamesSet = sParse.colNamesSet + '\x01';
    *(int *)(zSql_local + 0x158) = *(int *)(zSql_local + 0x158) + 1;
  }
  for (sParse.pWithToFree._0_4_ = 0; (int)sParse.pWithToFree < *(int *)(zSql_local + 0x28);
      sParse.pWithToFree._0_4_ = (int)sParse.pWithToFree + 1) {
    p = *(Btree **)(*(long *)(zSql_local + 0x20) + (long)(int)sParse.pWithToFree * 0x20 + 8);
    if (p != (Btree *)0x0) {
      sParse.pWithToFree._4_4_ = sqlite3BtreeSchemaLocked(p);
      if (sParse.pWithToFree._4_4_ != 0) {
        sqlite3ErrorWithMsg((sqlite3 *)zSql_local,sParse.pWithToFree._4_4_,
                            "database schema is locked: %s",
                            *(undefined8 *)
                             (*(long *)(zSql_local + 0x20) + (long)(int)sParse.pWithToFree * 0x20));
        goto LAB_0016ced8;
      }
      sParse.pWithToFree._4_4_ = 0;
    }
  }
  sqlite3VtabUnlockList((sqlite3 *)zSql_local);
  pBt = (Btree *)zSql_local;
  if ((pReprepare_local._4_4_ < 0) ||
     ((pReprepare_local._4_4_ != 0 && (_prepFlags_local[pReprepare_local._4_4_ + -1] == '\0')))) {
    sqlite3RunParser((Parse *)&pBt,_prepFlags_local,(char **)&i);
  }
  else {
    if (*(int *)(zSql_local + 0x74) < pReprepare_local._4_4_) {
      sqlite3ErrorWithMsg((sqlite3 *)zSql_local,0x12,"statement too long");
      sParse.pWithToFree._4_4_ = sqlite3ApiExit((sqlite3 *)zSql_local,0x12);
      goto LAB_0016ced8;
    }
    zSql_00 = sqlite3DbStrNDup((sqlite3 *)zSql_local,_prepFlags_local,(long)pReprepare_local._4_4_);
    if (zSql_00 == (char *)0x0) {
      sParse.pReprepare = (Vdbe *)(_prepFlags_local + pReprepare_local._4_4_);
    }
    else {
      sqlite3RunParser((Parse *)&pBt,zSql_00,(char **)&i);
      sParse.pReprepare = (Vdbe *)(_prepFlags_local + ((long)sParse.pReprepare - (long)zSql_00));
      sqlite3DbFree((sqlite3 *)zSql_local,zSql_00);
    }
  }
  if ((int)sParse.pVdbe == 0x65) {
    sParse.pVdbe._0_4_ = 0;
  }
  if (sParse.pVdbe._5_1_ != '\0') {
    schemaIsValid((Parse *)&pBt);
  }
  if (zSql_local[0x55] != '\0') {
    sParse.pVdbe._0_4_ = 7;
  }
  if (pzTail != (char **)0x0) {
    *pzTail = (char *)sParse.pReprepare;
  }
  sParse.pWithToFree._4_4_ = (int)sParse.pVdbe;
  if ((((int)sParse.pVdbe == 0) && (sParse.zErrMsg != (char *)0x0)) &&
     (sParse.sLastToken.n._3_1_ != '\0')) {
    if (sParse.sLastToken.n._3_1_ == '\x02') {
      sqlite3VdbeSetNumCols((Vdbe *)sParse.zErrMsg,4);
      local_2b0 = 8;
      pT._4_4_ = 0xc;
    }
    else {
      sqlite3VdbeSetNumCols((Vdbe *)sParse.zErrMsg,8);
      local_2b0 = 0;
      pT._4_4_ = 8;
    }
    for (sParse.pWithToFree._0_4_ = local_2b0; (int)sParse.pWithToFree < pT._4_4_;
        sParse.pWithToFree._0_4_ = (int)sParse.pWithToFree + 1) {
      sqlite3VdbeSetColName
                ((Vdbe *)sParse.zErrMsg,(int)sParse.pWithToFree - local_2b0,0,
                 sqlite3Prepare::azColName[(int)sParse.pWithToFree],(_func_void_void_ptr *)0x0);
    }
  }
  if (zSql_local[0xa9] == '\0') {
    sqlite3VdbeSetSql((Vdbe *)sParse.zErrMsg,_prepFlags_local,
                      (int)sParse.pReprepare - (int)_prepFlags_local,(u8)(u32)pReprepare_local);
  }
  if ((sParse.zErrMsg == (char *)0x0) ||
     ((sParse.pWithToFree._4_4_ == 0 && (zSql_local[0x55] == '\0')))) {
    *(char **)zErrMsg = sParse.zErrMsg;
  }
  else {
    sqlite3VdbeFinalize((Vdbe *)sParse.zErrMsg);
  }
  if (_i == (char *)0x0) {
    sqlite3Error((sqlite3 *)zSql_local,sParse.pWithToFree._4_4_);
  }
  else {
    sqlite3ErrorWithMsg((sqlite3 *)zSql_local,sParse.pWithToFree._4_4_,"%s",_i);
    sqlite3DbFree((sqlite3 *)zSql_local,_i);
  }
  while (p_00 = sParse.pZombieTab, sParse.pZombieTab != (Table *)0x0) {
    sParse.pZombieTab = (Table *)(sParse.pZombieTab)->aCol;
    sqlite3DbFree((sqlite3 *)zSql_local,p_00);
  }
LAB_0016ced8:
  sqlite3ParserReset((Parse *)&pBt);
  iVar1 = sqlite3ApiExit((sqlite3 *)zSql_local,sParse.pWithToFree._4_4_);
  return iVar1;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  char *zErrMsg = 0;        /* Error message */
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  memset(&sParse, 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pReprepare = pReprepare;
  assert( ppStmt && *ppStmt==0 );
  /* assert( !db->mallocFailed ); // not true with SQLITE_USE_ALLOCA */
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    db->lookaside.bDisable++;
  }

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold 
  ** locks on the schema, we just need to make sure nobody else is 
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  for(i=0; i<db->nDb; i++) {
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      assert( sqlite3BtreeHoldsMutex(pBt) );
      rc = sqlite3BtreeSchemaLocked(pBt);
      if( rc ){
        const char *zDb = db->aDb[i].zDbSName;
        sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
        testcase( db->flags & SQLITE_ReadUncommit );
        goto end_prepare;
      }
    }
  }

  sqlite3VtabUnlockList(db);

  sParse.db = db;
  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy, &zErrMsg);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql, &zErrMsg);
  }
  assert( 0==sParse.nQueryLoop );

  if( sParse.rc==SQLITE_DONE ) sParse.rc = SQLITE_OK;
  if( sParse.checkSchema ){
    schemaIsValid(&sParse);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
  }
  if( pzTail ){
    *pzTail = sParse.zTail;
  }
  rc = sParse.rc;

#ifndef SQLITE_OMIT_EXPLAIN
  if( rc==SQLITE_OK && sParse.pVdbe && sParse.explain ){
    static const char * const azColName[] = {
       "addr", "opcode", "p1", "p2", "p3", "p4", "p5", "comment",
       "selectid", "order", "from", "detail"
    };
    int iFirst, mx;
    if( sParse.explain==2 ){
      sqlite3VdbeSetNumCols(sParse.pVdbe, 4);
      iFirst = 8;
      mx = 12;
    }else{
      sqlite3VdbeSetNumCols(sParse.pVdbe, 8);
      iFirst = 0;
      mx = 8;
    }
    for(i=iFirst; i<mx; i++){
      sqlite3VdbeSetColName(sParse.pVdbe, i-iFirst, COLNAME_NAME,
                            azColName[i], SQLITE_STATIC);
    }
  }
#endif

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( sParse.pVdbe && (rc!=SQLITE_OK || db->mallocFailed) ){
    sqlite3VdbeFinalize(sParse.pVdbe);
    assert(!(*ppStmt));
  }else{
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
  }

  if( zErrMsg ){
    sqlite3ErrorWithMsg(db, rc, "%s", zErrMsg);
    sqlite3DbFree(db, zErrMsg);
  }else{
    sqlite3Error(db, rc);
  }

  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  return rc;
}